

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt(LocationRecorder *this,Token *token)

{
  Token *token_local;
  LocationRecorder *this_local;
  
  SourceCodeInfo_Location::set_span(this->location_,0,token->line);
  SourceCodeInfo_Location::set_span(this->location_,1,token->column);
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const io::Tokenizer::Token& token) {
  location_->set_span(0, token.line);
  location_->set_span(1, token.column);
}